

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O1

unsigned_long __thiscall CSSColorMap::GetRGBForColorName(CSSColorMap *this,string *inColorName)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  iterator iVar4;
  unsigned_long uVar5;
  size_type sVar6;
  string key;
  key_type local_48;
  
  pcVar1 = (inColorName->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + inColorName->_M_string_length);
  _Var2._M_p = local_48._M_dataplus._M_p;
  if (local_48._M_string_length != 0) {
    sVar6 = 0;
    do {
      iVar3 = tolower((int)_Var2._M_p[sVar6]);
      _Var2._M_p[sVar6] = (char)iVar3;
      sVar6 = sVar6 + 1;
    } while (local_48._M_string_length != sVar6);
  }
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)this,&local_48);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->mColorMap)._M_t._M_impl.super__Rb_tree_header) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(unsigned_long *)(iVar4._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return uVar5;
}

Assistant:

unsigned long CSSColorMap::GetRGBForColorName(const std::string& inColorName)
{
    std::string key = inColorName;
    
    // convert to lower case, to match against color names
    std::transform(key.begin(), key.end(), key.begin(), ::tolower);
    
    StringToULongMap::iterator it = mColorMap.find(key);
    
    if(it == mColorMap.end())
        return 0;
    else
        return it->second;
}